

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O2

int __thiscall
deqp::gls::RandomUniformBlockCase::init(RandomUniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int iVar1;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  iVar1 = extraout_EAX;
  iVar5 = 0;
  if (0 < this->m_maxSharedBlocks) {
    iVar1 = de::Random::getInt(&rnd,1,this->m_maxSharedBlocks);
    iVar5 = iVar1;
  }
  iVar2 = this->m_maxVertexBlocks - iVar5;
  iVar4 = 0;
  if (0 < iVar2) {
    iVar1 = de::Random::getInt(&rnd,1,iVar2);
    iVar4 = iVar1;
  }
  iVar3 = this->m_maxFragmentBlocks - iVar5;
  iVar2 = 0;
  if (0 < iVar3) {
    iVar1 = de::Random::getInt(&rnd,1,iVar3);
    iVar2 = iVar1;
  }
  iVar3 = 0;
  if (0 < iVar5) {
    iVar3 = iVar5;
  }
  while (iVar3 != 0) {
    generateBlock(this,&rnd,0x300);
    iVar1 = extraout_EAX_00;
    iVar3 = iVar3 + -1;
  }
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  while (iVar5 != 0) {
    generateBlock(this,&rnd,0x100);
    iVar1 = extraout_EAX_01;
    iVar5 = iVar5 + -1;
  }
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  while (iVar5 != 0) {
    generateBlock(this,&rnd,0x200);
    iVar1 = extraout_EAX_02;
    iVar5 = iVar5 + -1;
  }
  return iVar1;
}

Assistant:

void RandomUniformBlockCase::init (void)
{
	de::Random rnd(m_seed);

	int numShared		= m_maxSharedBlocks				> 0	? rnd.getInt(1, m_maxSharedBlocks)				: 0;
	int numVtxBlocks	= m_maxVertexBlocks-numShared	> 0	? rnd.getInt(1, m_maxVertexBlocks-numShared)	: 0;
	int	numFragBlocks	= m_maxFragmentBlocks-numShared	> 0 ? rnd.getInt(1, m_maxFragmentBlocks-numShared)	: 0;

	for (int ndx = 0; ndx < numShared; ndx++)
		generateBlock(rnd, DECLARE_VERTEX|DECLARE_FRAGMENT);

	for (int ndx = 0; ndx < numVtxBlocks; ndx++)
		generateBlock(rnd, DECLARE_VERTEX);

	for (int ndx = 0; ndx < numFragBlocks; ndx++)
		generateBlock(rnd, DECLARE_FRAGMENT);
}